

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_cmpxchgw_le_aarch64
                   (CPUArchState_conflict1 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  ushort uVar1;
  ushort *puVar2;
  bool bVar3;
  uintptr_t unaff_retaddr;
  undefined2 local_34;
  unsigned_short _old;
  uint16_t ret;
  uint16_t *haddr;
  undefined2 local_20;
  TCGMemOpIdx oi_local;
  uint32_t newv_local;
  uint32_t cmpv_local;
  target_ulong addr_local;
  CPUArchState_conflict1 *env_local;
  
  puVar2 = (ushort *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  oi_local._0_2_ = (ushort)cmpv;
  local_34 = (ushort)oi_local;
  local_20 = (ushort)newv;
  LOCK();
  uVar1 = *puVar2;
  bVar3 = (ushort)oi_local == uVar1;
  if (bVar3) {
    *puVar2 = local_20;
    uVar1 = (ushort)oi_local;
  }
  UNLOCK();
  if (!bVar3) {
    local_34 = uVar1;
  }
  return (uint32_t)local_34;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}